

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void string_process_escapes(string *input)

{
  char cVar1;
  undefined1 uVar2;
  char *pcVar3;
  long lVar4;
  undefined1 *puVar5;
  ulong in_RDI;
  long val;
  char *err_p;
  char x [3];
  size_t input_idx;
  size_t output_idx;
  size_t input_len;
  char *local_30;
  char local_23;
  undefined1 local_22;
  char local_21;
  ulong local_20;
  long local_18;
  ulong local_10;
  ulong local_8;
  
  local_8 = in_RDI;
  local_10 = std::__cxx11::string::length();
  local_18 = 0;
  local_20 = 0;
  do {
    if (local_10 <= local_20) {
      std::__cxx11::string::resize(local_8);
      return;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[](local_8);
    if ((*pcVar3 == '\\') && (local_20 + 1 < local_10)) {
      local_20 = local_20 + 1;
      pcVar3 = (char *)std::__cxx11::string::operator[](local_8);
      cVar1 = *pcVar3;
      if (cVar1 == '\"') {
        local_18 = local_18 + 1;
        puVar5 = (undefined1 *)std::__cxx11::string::operator[](local_8);
        *puVar5 = 0x22;
      }
      else if (cVar1 == '\'') {
        local_18 = local_18 + 1;
        puVar5 = (undefined1 *)std::__cxx11::string::operator[](local_8);
        *puVar5 = 0x27;
      }
      else if (cVar1 == '\\') {
        local_18 = local_18 + 1;
        puVar5 = (undefined1 *)std::__cxx11::string::operator[](local_8);
        *puVar5 = 0x5c;
      }
      else if (cVar1 == 'n') {
        local_18 = local_18 + 1;
        puVar5 = (undefined1 *)std::__cxx11::string::operator[](local_8);
        *puVar5 = 10;
      }
      else if (cVar1 == 'r') {
        local_18 = local_18 + 1;
        puVar5 = (undefined1 *)std::__cxx11::string::operator[](local_8);
        *puVar5 = 0xd;
      }
      else if (cVar1 == 't') {
        local_18 = local_18 + 1;
        puVar5 = (undefined1 *)std::__cxx11::string::operator[](local_8);
        *puVar5 = 9;
      }
      else {
        if ((cVar1 == 'x') && (local_20 + 2 < local_10)) {
          pcVar3 = (char *)std::__cxx11::string::operator[](local_8);
          local_23 = *pcVar3;
          puVar5 = (undefined1 *)std::__cxx11::string::operator[](local_8);
          local_22 = *puVar5;
          local_21 = '\0';
          local_30 = (char *)0x0;
          lVar4 = strtol(&local_23,&local_30,0x10);
          if (local_30 == &local_21) {
            local_20 = local_20 + 2;
            local_18 = local_18 + 1;
            puVar5 = (undefined1 *)std::__cxx11::string::operator[](local_8);
            *puVar5 = (char)lVar4;
            goto LAB_0032cb0f;
          }
        }
        local_18 = local_18 + 1;
        puVar5 = (undefined1 *)std::__cxx11::string::operator[](local_8);
        *puVar5 = 0x5c;
        puVar5 = (undefined1 *)std::__cxx11::string::operator[](local_8);
        uVar2 = *puVar5;
        local_18 = local_18 + 1;
        puVar5 = (undefined1 *)std::__cxx11::string::operator[](local_8);
        *puVar5 = uVar2;
      }
    }
    else {
      puVar5 = (undefined1 *)std::__cxx11::string::operator[](local_8);
      uVar2 = *puVar5;
      local_18 = local_18 + 1;
      puVar5 = (undefined1 *)std::__cxx11::string::operator[](local_8);
      *puVar5 = uVar2;
    }
LAB_0032cb0f:
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void string_process_escapes(std::string & input) {
    std::size_t input_len = input.length();
    std::size_t output_idx = 0;

    for (std::size_t input_idx = 0; input_idx < input_len; ++input_idx) {
        if (input[input_idx] == '\\' && input_idx + 1 < input_len) {
            switch (input[++input_idx]) {
                case 'n':  input[output_idx++] = '\n'; break;
                case 'r':  input[output_idx++] = '\r'; break;
                case 't':  input[output_idx++] = '\t'; break;
                case '\'': input[output_idx++] = '\''; break;
                case '\"': input[output_idx++] = '\"'; break;
                case '\\': input[output_idx++] = '\\'; break;
                case 'x':
                    // Handle \x12, etc
                    if (input_idx + 2 < input_len) {
                        const char x[3] = { input[input_idx + 1], input[input_idx + 2], 0 };
                        char *err_p = nullptr;
                        const long val = std::strtol(x, &err_p, 16);
                        if (err_p == x + 2) {
                            input_idx += 2;
                            input[output_idx++] = char(val);
                            break;
                        }
                    }
                    // fall through
                default:   input[output_idx++] = '\\';
                           input[output_idx++] = input[input_idx]; break;
            }
        } else {
            input[output_idx++] = input[input_idx];
        }
    }

    input.resize(output_idx);
}